

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O2

void __thiscall Chunk::Chunk(Chunk *this,LodRenderer *lodRenderer,repr coords)

{
  int iVar1;
  
  memset(this,0,0x1010);
  this->lodRenderer_ = lodRenderer;
  this->coords_ = coords;
  (this->dirtyFlags_).super__Base_bitset<1UL>._M_w = 0;
  this->empty_ = true;
  this->highlighted_ = false;
  if (Chunk(LodRenderer*,unsigned_long)::staticInit == '\0') {
    iVar1 = __cxa_guard_acquire(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    if (iVar1 != 0) {
      StaticInit::StaticInit(&Chunk::staticInit);
      __cxa_guard_release(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    }
  }
  staticInit_ = &Chunk::staticInit;
  return;
}

Assistant:

Chunk::Chunk(LodRenderer* lodRenderer, ChunkCoords::repr coords) :
    tiles_{},
    entities_(),
    entitiesCapacity_(0),
    lodRenderer_(lodRenderer),
    coords_(coords),
    dirtyFlags_(),
    empty_(true), 
    highlighted_(false) {

    static StaticInit staticInit;
    staticInit_ = &staticInit;
}